

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_char,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  byte bVar2;
  undefined4 uVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  long lVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  int iVar18;
  float *pfVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  bVar2 = (k->res).ulog2;
  iVar21 = nTxChan << (bVar2 & 0x1f);
  lVar15 = (long)iVar21 * (long)k->vw;
  if ((int)lVar15 != 0) {
    puVar17 = (undefined4 *)((long)data + (long)(((k->v << (bVar2 & 0x1f)) + k->u) * nTxChan));
    puVar16 = (undefined4 *)(lVar15 + (long)puVar17);
    pfVar4 = k->ku;
    pfVar19 = k->kv;
    lVar20 = (long)nTxChan;
    lVar15 = k->uw * lVar20;
    iVar18 = (int)lVar15;
    do {
      uVar3 = *puVar17;
      uVar12 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar12;
      auVar6[0xc] = (char)((uint)uVar3 >> 0x18);
      auVar7[8] = (char)((uint)uVar3 >> 0x10);
      auVar7._0_8_ = uVar12;
      auVar7[9] = 0;
      auVar7._10_3_ = auVar6._10_3_;
      auVar13._5_8_ = 0;
      auVar13._0_5_ = auVar7._8_5_;
      auVar8[4] = (char)((uint)uVar3 >> 8);
      auVar8._0_4_ = (int)uVar12;
      auVar8[5] = 0;
      auVar8._6_7_ = SUB137(auVar13 << 0x40,6);
      fVar26 = *pfVar4;
      fVar23 = fVar26 * (float)(int)uVar12;
      fVar24 = fVar26 * (float)auVar8._4_4_;
      fVar25 = fVar26 * (float)auVar7._8_4_;
      fVar26 = fVar26 * (float)(uint3)(auVar6._10_3_ >> 0x10);
      lVar22 = lVar15;
      pfVar5 = pfVar4;
      if (iVar18 != nTxChan) {
        do {
          uVar3 = *(undefined4 *)((long)puVar17 + lVar20);
          puVar17 = (undefined4 *)((long)puVar17 + lVar20);
          uVar12 = (ulong)(ushort)uVar3 & 0xffffffffffff00ff;
          auVar9._8_4_ = 0;
          auVar9._0_8_ = uVar12;
          auVar9[0xc] = (char)((uint)uVar3 >> 0x18);
          auVar10[8] = (char)((uint)uVar3 >> 0x10);
          auVar10._0_8_ = uVar12;
          auVar10[9] = 0;
          auVar10._10_3_ = auVar9._10_3_;
          auVar14._5_8_ = 0;
          auVar14._0_5_ = auVar10._8_5_;
          auVar11[4] = (char)((uint)uVar3 >> 8);
          auVar11._0_4_ = (int)uVar12;
          auVar11[5] = 0;
          auVar11._6_7_ = SUB137(auVar14 << 0x40,6);
          fVar1 = pfVar5[1];
          fVar23 = fVar23 + fVar1 * (float)(int)uVar12;
          fVar24 = fVar24 + fVar1 * (float)auVar11._4_4_;
          fVar25 = fVar25 + fVar1 * (float)auVar10._8_4_;
          fVar26 = fVar26 + fVar1 * (float)(uint3)(auVar9._10_3_ >> 0x10);
          lVar22 = lVar22 - lVar20;
          pfVar5 = pfVar5 + 1;
        } while (lVar20 != lVar22);
      }
      puVar17 = (undefined4 *)((long)puVar17 + (iVar21 - iVar18) + lVar20);
      fVar1 = *pfVar19;
      pfVar19 = pfVar19 + 1;
      *result = fVar1 * fVar23 + *result;
      result[1] = fVar1 * fVar24 + result[1];
      result[2] = fVar1 * fVar25 + result[2];
      result[3] = fVar1 * fVar26 + result[3];
    } while (puVar17 != puVar16);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }